

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O2

void __thiscall TPZVec<Fad<float>_>::Resize(TPZVec<Fad<float>_> *this,int64_t newsize)

{
  Fad<float> *pFVar1;
  ostream *poVar2;
  int64_t *piVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  bool bVar7;
  
  if (newsize < 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"TPZVec::Resize. Bad parameter newsize: ");
    poVar2 = std::ostream::_M_insert<long>((long)poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    std::ostream::flush();
  }
  lVar4 = this->fNElements;
  if (lVar4 != newsize) {
    if (newsize == 0) {
      this->fNElements = 0;
      this->fNAlloc = 0;
      pFVar1 = this->fStore;
      if (pFVar1 != (Fad<float> *)0x0) {
        lVar4 = *(long *)&pFVar1[-1].defaultVal;
        if (lVar4 != 0) {
          lVar6 = lVar4 << 5;
          do {
            Vector<float>::destroy((Vector<float> *)((long)pFVar1 + lVar6 + -0x18));
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
        }
        operator_delete__(&pFVar1[-1].defaultVal,lVar4 << 5 | 8);
      }
      this->fStore = (Fad<float> *)0x0;
    }
    else {
      uVar5 = 0;
      piVar3 = (int64_t *)operator_new__(-(ulong)((ulong)newsize >> 0x3b != 0) | newsize << 5 | 8);
      *piVar3 = newsize;
      do {
        *(undefined4 *)((long)piVar3 + uVar5 + 8) = 0;
        *(undefined4 *)((long)piVar3 + uVar5 + 0x10) = 0;
        *(undefined8 *)((long)piVar3 + uVar5 + 0x18) = 0;
        *(undefined4 *)((long)piVar3 + uVar5 + 0x20) = 0;
        uVar5 = uVar5 + 0x20;
      } while (newsize << 5 != uVar5);
      if (newsize <= lVar4) {
        lVar4 = newsize;
      }
      lVar6 = 0;
      if (lVar4 < 1) {
        lVar4 = lVar6;
      }
      while( true ) {
        pFVar1 = this->fStore;
        bVar7 = lVar4 == 0;
        lVar4 = lVar4 + -1;
        if (bVar7) break;
        Fad<float>::operator=
                  ((Fad<float> *)((long)&((Fad<float> *)(piVar3 + 1))->val_ + lVar6),
                   (Fad<float> *)((long)&pFVar1->val_ + lVar6));
        lVar6 = lVar6 + 0x20;
      }
      if (pFVar1 != (Fad<float> *)0x0) {
        lVar4 = *(long *)&pFVar1[-1].defaultVal;
        if (lVar4 != 0) {
          lVar6 = lVar4 << 5;
          do {
            Vector<float>::destroy((Vector<float> *)((long)pFVar1 + lVar6 + -0x18));
            lVar6 = lVar6 + -0x20;
          } while (lVar6 != 0);
        }
        operator_delete__(&pFVar1[-1].defaultVal,lVar4 << 5 | 8);
      }
      this->fStore = (Fad<float> *)(piVar3 + 1);
      this->fNElements = newsize;
      this->fNAlloc = newsize;
    }
  }
  return;
}

Assistant:

void TPZVec<T>::Resize(const int64_t newsize) {
#ifndef PZNODEBUG
    //	int64_t nlongsize = 2147483647;
	if(newsize<0) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
	}
#ifdef WIN32
	// Parece que o limite no windows é
	int sz = sizeof(T);
	int64_t nlongsize = 1704792168;
	if((newsize+1) > (1./sz)*nlongsize) {
		PZError << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		std::cout << "TPZVec::Resize. Bad parameter newsize: " << newsize <<  std::endl;
		PZError.flush();
        //		DebugStop();
        //		return;
	}
#endif
#endif
	
	if(newsize == fNElements) return;
	if (newsize == 0) {
		fNElements = 0;
        fNAlloc = 0;
		delete[] fStore;
		fStore = nullptr;
		return;
	}
	T *newstore = new T[newsize];
	int64_t large = (fNElements < newsize) ? fNElements : newsize;
	int64_t i;
	for(i=0L; i<large; i++) {
		newstore[i] = fStore[i];
	}
	if(fStore) delete[] fStore;
	fStore = newstore;
	fNElements = newsize;
    fNAlloc = newsize;
}